

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::FindRequiresForExtension
          (Generator *this,GeneratorOptions *options,FieldDescriptor *field,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *required,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *forwards)

{
  bool bVar1;
  Descriptor *descriptor;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string sStack_48;
  
  pbVar2 = &sStack_48;
  __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
           (*(long *)(field + 0x58) + 8);
  descriptor = (Descriptor *)required;
  bVar1 = std::operator!=(__lhs,"google.protobuf.bridge.MessageSet");
  if (bVar1) {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&sStack_48,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x58),
               descriptor);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)required,&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
    __lhs = pbVar2;
  }
  FindRequiresForField((Generator *)__lhs,options,field,required,forwards);
  return;
}

Assistant:

void Generator::FindRequiresForExtension(const GeneratorOptions& options,
                                         const FieldDescriptor* field,
                                         std::set<string>* required,
                                         std::set<string>* forwards) const {
    if (field->containing_type()->full_name() != "google.protobuf.bridge.MessageSet") {
      required->insert(GetMessagePath(options, field->containing_type()));
    }
    FindRequiresForField(options, field, required, forwards);
}